

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mchain_details.hpp
# Opt level: O1

extraction_status_t __thiscall
so_5::mchain_props::
mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
::extract(mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,_so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>
          *this,demand_t *dest,duration_t empty_queue_timeout)

{
  status sVar1;
  extraction_status_t eVar2;
  long lVar3;
  anon_class_16_2_0c77c6cc __p;
  bool queue_empty;
  unique_lock<std::mutex> lock;
  bool local_41;
  unique_lock<std::mutex> local_40;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  
  local_40._M_device = &this->m_lock;
  local_40._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  local_41 = (this->m_queue).m_size == 0;
  if (local_41) {
    eVar2 = chain_closed;
    if (this->m_status == closed) goto LAB_00215225;
    this->m_threads_to_wakeup = this->m_threads_to_wakeup + 1;
    if (empty_queue_timeout.__r == 0x7fffffffffffffff) {
      local_41 = (this->m_queue).m_size == 0;
      if (local_41) {
        sVar1 = this->m_status;
        while (sVar1 != closed) {
          std::condition_variable::wait((unique_lock *)&this->m_underflow_cond);
          local_41 = (this->m_queue).m_size == 0;
          if (!local_41) break;
          sVar1 = this->m_status;
        }
      }
    }
    else {
      lVar3 = std::chrono::_V2::steady_clock::now();
      local_30.__d.__r = (duration)(lVar3 + empty_queue_timeout.__r);
      __p.queue_empty = &local_41;
      __p.this = this;
      std::condition_variable::
      wait_until<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>,so_5::mchain_props::mchain_template<so_5::mchain_props::details::limited_preallocated_demand_queue,so_5::impl::msg_tracing_helpers::mchain_tracing_disabled_base>::extract(so_5::mchain_props::demand_t&,std::chrono::duration<long,std::ratio<1l,1000000000l>>)::_lambda()_1_>
                (&this->m_underflow_cond,&local_40,&local_30,__p);
    }
    this->m_threads_to_wakeup = this->m_threads_to_wakeup - 1;
  }
  if (local_41 == true) {
    eVar2 = (uint)(this->m_status != open) * 2;
  }
  else {
    eVar2 = extract_demand_from_not_empty_queue(this,dest);
  }
LAB_00215225:
  std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return eVar2;
}

Assistant:

virtual extraction_status_t
		extract(
			demand_t & dest,
			duration_t empty_queue_timeout ) override
			{
				std::unique_lock< std::mutex > lock{ m_lock };

				// If queue is empty we must wait for some time.
				bool queue_empty = m_queue.is_empty();
				if( queue_empty )
					{
						if( details::status::closed == m_status )
							// Waiting for new messages has no sence because
							// chain is closed.
							return extraction_status_t::chain_closed;

						auto predicate = [this, &queue_empty]() -> bool {
								queue_empty = m_queue.is_empty();
								return !queue_empty ||
										details::status::closed == m_status;
							};

						// Count of sleeping thread must be incremented before
						// going to sleep and decremented right after.
						++m_threads_to_wakeup;
						auto decrement_threads = so_5::details::at_scope_exit(
								[this] { --m_threads_to_wakeup; } );

						if( !details::is_infinite_wait_timevalue( empty_queue_timeout ) )
							// A wait with finite timeout must be performed.
							m_underflow_cond.wait_for(
									lock, empty_queue_timeout, predicate );
						else
							// Wait until arrival of any message or closing of chain.
							m_underflow_cond.wait( lock, predicate );
					}

				// If queue is still empty nothing can be extracted and
				// we must stop operation.
				if( queue_empty )
					return details::status::open == m_status ?
							// The chain is still open so there must be this result
							extraction_status_t::no_messages :
							// The chain is closed and there must be different result
							extraction_status_t::chain_closed;

				return extract_demand_from_not_empty_queue( dest );
			}